

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonElementDecl(void *user_data,xmlChar *name,int type,xmlElementContentPtr content)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  PyObject *result;
  PyObject *obj;
  PyObject *handler;
  xmlElementContentPtr content_local;
  int type_local;
  xmlChar *name_local;
  void *user_data_local;
  
  iVar1 = PyObject_HasAttrString(user_data,"elementDecl");
  if (iVar1 != 0) {
    printf("pythonElementDecl: xmlElementContentPtr wrapper missing !\n");
    op = (PyObject *)
         _PyObject_CallMethod_SizeT(user_data,"elementDecl","siO",name,type,&_Py_NoneStruct);
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
  }
  return;
}

Assistant:

static void
pythonElementDecl(void *user_data,
                  const xmlChar * name,
                  int type, ATTRIBUTE_UNUSED xmlElementContentPtr content)
{
    PyObject *handler;
    PyObject *obj;
    PyObject *result;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "elementDecl")) {
        /* TODO: wrap in an elementContent object */
        printf
            ("pythonElementDecl: xmlElementContentPtr wrapper missing !\n");
        obj = Py_None;
        /* Py_XINCREF(Py_None); isn't the reference just borrowed ??? */
        result = PyObject_CallMethod(handler, (char *) "elementDecl",
                                     (char *) "siO", name, type, obj);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}